

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util_threadnames_tests.cpp
# Opt level: O0

void __thiscall
util_threadnames_tests::util_threadnames_test_rename_threaded::test_method
          (util_threadnames_test_rename_threaded *this)

{
  long lVar1;
  bool bVar2;
  long in_FS_OFFSET;
  int i;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  char *in_stack_fffffffffffffe28;
  key_type *in_stack_fffffffffffffe30;
  char *in_stack_fffffffffffffe38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe40;
  undefined7 in_stack_fffffffffffffe50;
  undefined1 in_stack_fffffffffffffe57;
  lazy_ostream *in_stack_fffffffffffffe58;
  iterator in_stack_fffffffffffffe60;
  unit_test_log_t *in_stack_fffffffffffffe68;
  unit_test_log_t *this_00;
  const_string local_160 [2];
  lazy_ostream local_140 [2];
  _Base_ptr local_120;
  _Base_ptr local_118;
  assertion_result local_110 [2];
  int local_d8;
  undefined4 local_d4;
  size_type local_d0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  RenameEnMasse_abi_cxx11_((int)((ulong)in_stack_fffffffffffffe68 >> 0x20));
  do {
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
    boost::unit_test::unit_test_log_t::set_checkpoint
              (in_stack_fffffffffffffe68,(const_string *)in_stack_fffffffffffffe60._M_node,
               (size_t)in_stack_fffffffffffffe58,
               (const_string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
    boost::unit_test::lazy_ostream::instance();
    boost::unit_test::operator<<
              ((lazy_ostream *)in_stack_fffffffffffffe30,(char (*) [1])in_stack_fffffffffffffe28);
    boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
              ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
               (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
    local_d0 = std::
               set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)in_stack_fffffffffffffe28);
    local_d4 = 100;
    in_stack_fffffffffffffe38 = "100U";
    in_stack_fffffffffffffe30 = (key_type *)&local_d4;
    in_stack_fffffffffffffe28 = "names.size()";
    boost::test_tools::tt_detail::
    check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_long,unsigned_int>
              (&stack0xffffffffffffff48,&stack0xffffffffffffff38,0x39,1,2,&local_d0);
    boost::unit_test::lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]>
    ::~lazy_ostream_impl
              ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_char[1],_const_char_(&)[1]> *)
               in_stack_fffffffffffffe28);
    bVar2 = boost::test_tools::tt_detail::dummy_cond();
  } while (bVar2);
  for (local_d8 = 0; local_d8 < 100; local_d8 = local_d8 + 1) {
    do {
      this_00 = boost::unit_test::(anonymous_namespace)::unit_test_log;
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe28);
      boost::unit_test::unit_test_log_t::set_checkpoint
                (this_00,(const_string *)in_stack_fffffffffffffe60._M_node,
                 (size_t)in_stack_fffffffffffffe58,
                 (const_string *)CONCAT17(in_stack_fffffffffffffe57,in_stack_fffffffffffffe50));
      util::ToString<int>((int *)in_stack_fffffffffffffe60._M_node);
      std::operator+(in_stack_fffffffffffffe40,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffe38);
      in_stack_fffffffffffffe60 =
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)in_stack_fffffffffffffe38,in_stack_fffffffffffffe30);
      local_118 = in_stack_fffffffffffffe60._M_node;
      local_120 = (_Base_ptr)
                  std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)in_stack_fffffffffffffe30);
      std::operator==((_Self *)in_stack_fffffffffffffe38,(_Self *)in_stack_fffffffffffffe30);
      boost::test_tools::assertion_result::assertion_result
                ((assertion_result *)in_stack_fffffffffffffe38,
                 SUB81((ulong)in_stack_fffffffffffffe30 >> 0x38,0));
      in_stack_fffffffffffffe58 = boost::unit_test::lazy_ostream::instance();
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      boost::unit_test::operator<<
                ((lazy_ostream *)in_stack_fffffffffffffe30,
                 (basic_cstring<const_char> *)in_stack_fffffffffffffe28);
      boost::unit_test::basic_cstring<const_char>::basic_cstring<unsigned_long>
                ((basic_cstring<const_char> *)in_stack_fffffffffffffe38,
                 (pointer)in_stack_fffffffffffffe30,(unsigned_long)in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe28 = (char *)0x0;
      boost::test_tools::tt_detail::report_assertion
                (local_110,local_140,local_160,0x3d,CHECK,CHECK_PRED);
      boost::unit_test::
      lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
      ::~lazy_ostream_impl
                ((lazy_ostream_impl<boost::unit_test::lazy_ostream,_boost::unit_test::basic_cstring<const_char>,_const_boost::unit_test::basic_cstring<const_char>_&>
                  *)in_stack_fffffffffffffe28);
      boost::test_tools::assertion_result::~assertion_result
                ((assertion_result *)in_stack_fffffffffffffe28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffe28);
      in_stack_fffffffffffffe57 = boost::test_tools::tt_detail::dummy_cond();
    } while ((bool)in_stack_fffffffffffffe57);
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_stack_fffffffffffffe28);
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(util_threadnames_test_rename_threaded)
{
    std::set<std::string> names = RenameEnMasse(100);

    BOOST_CHECK_EQUAL(names.size(), 100U);

    // Names "test_thread.[n]" should exist for n = [0, 99]
    for (int i = 0; i < 100; ++i) {
        BOOST_CHECK(names.find(TEST_THREAD_NAME_BASE + ToString(i)) != names.end());
    }

}